

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageFederateManager.cpp
# Opt level: O2

void __thiscall
helics::MessageFederateManager::updateTime(MessageFederateManager *this,Time newTime,Time param_2)

{
  SimpleQueue<std::unique_ptr<helics::Message,std::default_delete<helics::Message>>,std::mutex>
  *this_00;
  Endpoint *__args;
  int iVar1;
  undefined4 extraout_var;
  long lVar2;
  bool bVar3;
  InterfaceHandle endpoint_id;
  unique_ptr<helics::Message,_std::default_delete<helics::Message>_> message;
  handle epts;
  function<void_(helics::Endpoint_&,_TimeRepresentation<count_time<9,_long>_>)> mcall;
  BlockIterator<helics::Endpoint,_32,_helics::Endpoint_**> fid;
  InterfaceHandle local_a4;
  _Head_base<0UL,_helics::Message_*,_false> local_a0;
  handle local_98;
  function<void_(helics::Endpoint_&,_TimeRepresentation<count_time<9,_long>_>)> local_80;
  undefined1 local_60 [24];
  BlockIterator<helics::Endpoint,_32,_helics::Endpoint_**> local_48;
  
  (this->CurrentTime).internalTimeCode = newTime.internalTimeCode;
  iVar1 = (*this->coreObject->_vptr_Core[0x52])(this->coreObject,(ulong)(uint)(this->fedID).fid);
  lVar2 = CONCAT44(extraout_var,iVar1);
  if (lVar2 != 0) {
    local_a4.hid = -1700000000;
    gmlc::libguarded::
    shared_guarded_opt<gmlc::containers::DualStringMappedVector<helics::Endpoint,_helics::InterfaceHandle,_(reference_stability)0,_5>,_std::shared_mutex>
    ::lock(&local_98,&this->mLocalEndpoints);
    gmlc::libguarded::
    atomic_guarded<std::function<void_(helics::Endpoint_&,_TimeRepresentation<count_time<9,_long>_>)>,_std::mutex>
    ::load(&local_80,&this->allCallback);
    while (bVar3 = lVar2 != 0, lVar2 = lVar2 + -1, bVar3) {
      (*this->coreObject->_vptr_Core[0x51])
                (&local_a0,this->coreObject,(ulong)(uint)(this->fedID).fid,&local_a4);
      if (local_a0._M_head_impl == (Message *)0x0) {
        std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>::~unique_ptr
                  ((unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *)&local_a0);
        break;
      }
      gmlc::containers::
      DualStringMappedVector<helics::Endpoint,_helics::InterfaceHandle,_(reference_stability)0,_5>::
      find(&local_48,local_98.data,&local_a4);
      gmlc::containers::StableBlockVector<helics::Endpoint,_5U,_std::allocator<helics::Endpoint>_>::
      end((const_iterator *)local_60,&(local_98.data)->dataStorage);
      bVar3 = gmlc::containers::BlockIterator<helics::Endpoint,32,helics::Endpoint**>::operator!=
                        ((BlockIterator<helics::Endpoint,32,helics::Endpoint**> *)&local_48,
                         (const_iterator *)local_60);
      __args = local_48.ptr;
      if (bVar3) {
        this_00 = (SimpleQueue<std::unique_ptr<helics::Message,std::default_delete<helics::Message>>,std::mutex>
                   *)(local_48.ptr)->dataReference;
        gmlc::containers::
        SimpleQueue<std::unique_ptr<helics::Message,std::default_delete<helics::Message>>,std::mutex>
        ::emplace<std::unique_ptr<helics::Message,std::default_delete<helics::Message>>>
                  (this_00,(unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *)
                           &local_a0);
        if (*(long *)(this_00 + 0x98) == 0) {
          if (local_80.super__Function_base._M_manager == (_Manager_type)0x0) goto LAB_001b2b29;
          gmlc::libguarded::
          lock_handle<gmlc::containers::DualStringMappedVector<helics::Endpoint,_helics::InterfaceHandle,_(reference_stability)0,_5>,_std::shared_mutex>
          ::unlock(&local_98);
          std::function<void_(helics::Endpoint_&,_TimeRepresentation<count_time<9,_long>_>)>::
          operator()(&local_80,__args,
                     (TimeRepresentation<count_time<9,_long>_>)(this->CurrentTime).internalTimeCode)
          ;
          gmlc::libguarded::
          shared_guarded_opt<gmlc::containers::DualStringMappedVector<helics::Endpoint,_helics::InterfaceHandle,_(reference_stability)0,_5>,_std::shared_mutex>
          ::lock((handle *)local_60,&this->mLocalEndpoints);
        }
        else {
          gmlc::libguarded::
          lock_handle<gmlc::containers::DualStringMappedVector<helics::Endpoint,_helics::InterfaceHandle,_(reference_stability)0,_5>,_std::shared_mutex>
          ::unlock(&local_98);
          std::function<void_(helics::Endpoint_&,_TimeRepresentation<count_time<9,_long>_>)>::
          operator()((function<void_(helics::Endpoint_&,_TimeRepresentation<count_time<9,_long>_>)>
                      *)(this_00 + 0x88),__args,
                     (TimeRepresentation<count_time<9,_long>_>)(this->CurrentTime).internalTimeCode)
          ;
          gmlc::libguarded::
          shared_guarded_opt<gmlc::containers::DualStringMappedVector<helics::Endpoint,_helics::InterfaceHandle,_(reference_stability)0,_5>,_std::shared_mutex>
          ::lock((handle *)local_60,&this->mLocalEndpoints);
        }
        gmlc::libguarded::
        lock_handle<gmlc::containers::DualStringMappedVector<helics::Endpoint,_helics::InterfaceHandle,_(reference_stability)0,_5>,_std::shared_mutex>
        ::operator=(&local_98,
                    (lock_handle<gmlc::containers::DualStringMappedVector<helics::Endpoint,_helics::InterfaceHandle,_(reference_stability)0,_5>,_std::shared_mutex>
                     *)local_60);
        std::unique_lock<std::shared_mutex>::~unique_lock
                  ((unique_lock<std::shared_mutex> *)(local_60 + 8));
      }
LAB_001b2b29:
      std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>::~unique_ptr
                ((unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *)&local_a0);
    }
    std::_Function_base::~_Function_base(&local_80.super__Function_base);
    std::unique_lock<std::shared_mutex>::~unique_lock(&local_98.m_handle_lock);
  }
  return;
}

Assistant:

void MessageFederateManager::updateTime(Time newTime, Time /*oldTime*/)
{
    CurrentTime = newTime;
    auto epCount = coreObject->receiveCountAny(fedID);
    if (epCount == 0) {
        return;
    }
    InterfaceHandle endpoint_id;
    auto epts = mLocalEndpoints.lock();
    auto mcall = allCallback.load();
    for (size_t ii = 0; ii < epCount; ++ii) {
        auto message = coreObject->receiveAny(fedID, endpoint_id);
        if (!message) {
            break;
        }

        /** find the id*/
        auto fid = epts->find(endpoint_id);
        if (fid != epts->end()) {  // assign the data

            Endpoint& currentEpt = *fid;
            auto* eData = static_cast<EndpointData*>(fid->dataReference);

            eData->messages.emplace(std::move(message));

            if (eData->callback) {
                // need to be copied otherwise there is a potential race condition on lock removal
                epts.unlock();
                eData->callback(currentEpt, CurrentTime);
                epts = mLocalEndpoints.lock();
            } else if (mcall) {
                epts.unlock();
                mcall(currentEpt, CurrentTime);
                epts = mLocalEndpoints.lock();
            }
        }
    }
}